

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_open_filename.c
# Opt level: O0

wchar_t file_close2(archive_conflict *a,void *client_data)

{
  ssize_t sVar1;
  ssize_t bytesRead;
  read_file_data *mine;
  void *client_data_local;
  archive_conflict *a_local;
  
  if (-1 < *client_data) {
    if ((((*(uint *)((long)client_data + 0x18) & 0xf000) != 0x8000) &&
        ((*(uint *)((long)client_data + 0x18) & 0xf000) != 0x2000)) &&
       ((*(uint *)((long)client_data + 0x18) & 0xf000) != 0x6000)) {
      do {
        sVar1 = read(*client_data,*(void **)((long)client_data + 0x10),
                     *(size_t *)((long)client_data + 8));
      } while (0 < sVar1);
    }
    if (*(int *)((long)client_data + 0x2c) != 0) {
      close(*client_data);
    }
  }
  free(*(void **)((long)client_data + 0x10));
  *(undefined8 *)((long)client_data + 0x10) = 0;
  *(undefined4 *)client_data = 0xffffffff;
  return L'\0';
}

Assistant:

static int
file_close2(struct archive *a, void *client_data)
{
	struct read_file_data *mine = (struct read_file_data *)client_data;

	(void)a; /* UNUSED */

	/* Only flush and close if open succeeded. */
	if (mine->fd >= 0) {
		/*
		 * Sometimes, we should flush the input before closing.
		 *   Regular files: faster to just close without flush.
		 *   Disk-like devices:  Ditto.
		 *   Tapes: must not flush (user might need to
		 *      read the "next" item on a non-rewind device).
		 *   Pipes and sockets:  must flush (otherwise, the
		 *      program feeding the pipe or socket may complain).
		 * Here, I flush everything except for regular files and
		 * device nodes.
		 */
		if (!S_ISREG(mine->st_mode)
		    && !S_ISCHR(mine->st_mode)
		    && !S_ISBLK(mine->st_mode)) {
			ssize_t bytesRead;
			do {
				bytesRead = read(mine->fd, mine->buffer,
				    mine->block_size);
			} while (bytesRead > 0);
		}
		/* If a named file was opened, then it needs to be closed. */
		if (mine->filename_type != FNT_STDIN)
			close(mine->fd);
	}
	free(mine->buffer);
	mine->buffer = NULL;
	mine->fd = -1;
	return (ARCHIVE_OK);
}